

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QSet<QGesture*>>
          (QtPrivate *this,QDebug debug,char *which,QSet<QGesture_*> *c)

{
  char *pcVar1;
  ulong uVar2;
  storage_type *psVar3;
  storage_type *psVar4;
  QTextStream *pQVar5;
  ulong uVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  QTextStream *local_78;
  undefined1 local_70 [8];
  QGesture local_68;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar5 = *(QTextStream **)debug.stream;
  pQVar5[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar4;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar4;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar5,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar5,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar7 = (c->q_hash).d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar6 = 0;
LAB_002e07fb:
    if (pDVar7 == (Data *)0x0 && uVar6 == 0) goto LAB_002e0996;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (pDVar7->numBuckets == uVar6) {
          pDVar7 = (Data *)0x0;
          uVar6 = 0;
          break;
        }
        uVar2 = uVar6 + 1;
      } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      goto LAB_002e07fb;
    }
    uVar6 = 0;
  }
  local_68._0_8_ = *(undefined8 *)debug.stream;
  *(int *)(local_68._0_8_ + 0x28) = *(int *)(local_68._0_8_ + 0x28) + 1;
  ::operator<<((QDebug)&local_68.field_0x8,&local_68);
  QDebug::~QDebug((QDebug *)&local_68.field_0x8);
  QDebug::~QDebug((QDebug *)&local_68);
  do {
    if (pDVar7->numBuckets - 1 == uVar6) goto LAB_002e0996;
    uVar6 = uVar6 + 1;
  } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  do {
    pQVar5 = *(QTextStream **)debug.stream;
    QVar9.m_data = (storage_type *)0x2;
    QVar9.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar5,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar5 = *(QTextStream **)debug.stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = *(QTextStream **)debug.stream;
    }
    *(int *)(pQVar5 + 0x28) = *(int *)(pQVar5 + 0x28) + 1;
    local_78 = pQVar5;
    ::operator<<((Stream *)local_70,(QGesture *)&local_78);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug((QDebug *)&local_78);
    do {
      if (pDVar7->numBuckets - 1 == uVar6) {
        pDVar7 = (Data *)0x0;
        uVar6 = 0;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  } while ((pDVar7 != (Data *)0x0) || (uVar6 != 0));
LAB_002e0996:
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}